

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

bool peparse::getResources
               (bounded_buffer *b,bounded_buffer *fileBegin,
               vector<peparse::section,_std::allocator<peparse::section>_> *secs,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  pointer psVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  pointer psVar5;
  section s;
  
  if (b == (bounded_buffer *)0x0) {
    bVar2 = false;
  }
  else {
    psVar5 = (secs->super__Vector_base<peparse::section,_std::allocator<peparse::section>_>)._M_impl
             .super__Vector_impl_data._M_start;
    psVar1 = (secs->super__Vector_base<peparse::section,_std::allocator<peparse::section>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    do {
      if (psVar5 == psVar1) {
        cVar4 = '\x02';
        break;
      }
      section::section(&s,psVar5);
      bVar2 = std::operator!=(&s.sectionName,".rsrc");
      cVar4 = '\x03';
      if (!bVar2) {
        bVar3 = parse_resource_table
                          (s.sectionData,0,s.sec.VirtualAddress,0,(resource_dir_entry *)0x0,rsrcs);
        cVar4 = bVar3 + '\x01';
      }
      std::__cxx11::string::~string((string *)&s);
      psVar5 = psVar5 + 1;
    } while (bVar2);
    bVar2 = cVar4 == '\x02';
  }
  return bVar2;
}

Assistant:

bool getResources(bounded_buffer *b,
                  bounded_buffer *fileBegin,
                  const std::vector<section> secs,
                  std::vector<resource> &rsrcs) {
  static_cast<void>(fileBegin);

  if (b == nullptr)
    return false;

  for (section s : secs) {
    if (s.sectionName != ".rsrc") {
      continue;
    }

    if (!parse_resource_table(
            s.sectionData, 0, s.sec.VirtualAddress, 0, nullptr, rsrcs)) {
      return false;
    }

    break; // Because there should only be one .rsrc
  }

  return true;
}